

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
          (SourceLocationCommentPrinter *this,string *output)

{
  string local_60;
  AlphaNum local_40;
  
  if ((this->have_source_loc_ == true) &&
     ((this->source_loc_).trailing_comments._M_string_length != 0)) {
    FormatComment(&local_60,this,&(this->source_loc_).trailing_comments);
    local_40.piece_._M_len = local_60._M_string_length;
    local_40.piece_._M_str = local_60._M_dataplus._M_p;
    absl::lts_20250127::StrAppend(output,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void AddPostComment(std::string* output) {
    if (have_source_loc_ && source_loc_.trailing_comments.size() > 0) {
      absl::StrAppend(output, FormatComment(source_loc_.trailing_comments));
    }
  }